

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

intmatrix sptk::swipe::makeim(int xSz,int ySz)

{
  int **ppiVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  intmatrix iVar5;
  
  ppiVar1 = (int **)malloc((long)xSz * 8);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < xSz) {
    uVar4 = (ulong)(uint)xSz;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    piVar2 = (int *)malloc((long)ySz << 2);
    ppiVar1[uVar3] = piVar2;
  }
  iVar5.y = ySz;
  iVar5.x = xSz;
  iVar5.m = ppiVar1;
  return iVar5;
}

Assistant:

intmatrix makeim(int xSz, int ySz) {
    intmatrix nw_matrix;
    nw_matrix.x = xSz;
    nw_matrix.y = ySz;
#if 0
    nw_matrix.m = malloc(sizeof(int) * xSz);
#else
    nw_matrix.m = (int**) malloc(sizeof(int*) * xSz);
#endif
    int i;
    for (i = 0; i < nw_matrix.x; i++)
#if 0
        nw_matrix.m[i] = malloc(sizeof(int) * ySz);
#else
        nw_matrix.m[i] = (int*) malloc(sizeof(int) * ySz);
#endif
    return(nw_matrix);
}